

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

int Saig_MvHash(int iFan0,int iFan1,int TableSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint Key;
  int TableSize_local;
  int iFan1_local;
  int iFan0_local;
  
  if (iFan0 < iFan1) {
    iVar1 = Saig_MvLit2Var(iFan0);
    iVar2 = Saig_MvLit2Var(iFan1);
    iVar3 = Saig_MvIsComplement(iFan0);
    iVar4 = Saig_MvIsComplement(iFan1);
    return (uint)(iVar4 * 0x161 ^ iVar3 * 0x38f ^ iVar2 * 0xb9b ^ iVar1 * 0x1f01) % (uint)TableSize;
  }
  __assert_fail("iFan0 < iFan1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSimMv.c"
                ,0x11d,"int Saig_MvHash(int, int, int)");
}

Assistant:

static inline int Saig_MvHash( int iFan0, int iFan1, int TableSize ) 
{
    unsigned Key = 0;
    assert( iFan0 < iFan1 );
    Key ^= Saig_MvLit2Var(iFan0) * 7937;
    Key ^= Saig_MvLit2Var(iFan1) * 2971;
    Key ^= Saig_MvIsComplement(iFan0) * 911;
    Key ^= Saig_MvIsComplement(iFan1) * 353;
    return (int)(Key % TableSize);
}